

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O0

void __thiscall AllRgbWidget::onResetPixelsRequested(AllRgbWidget *this)

{
  QImage local_78 [47];
  anon_class_1_0_00000001 local_49;
  function<void_(QImage_&,_int,_int)> local_48;
  QImage local_28 [24];
  AllRgbWidget *local_10;
  AllRgbWidget *this_local;
  
  local_10 = this;
  QImage::QImage(local_28,0x1000,0x1000,Format_RGB32);
  QImage::operator=(&this->allRgb_,local_28);
  QImage::~QImage(local_28);
  std::function<void(QImage&,int,int)>::function<AllRgbWidget::onResetPixelsRequested()::__0,void>
            ((function<void(QImage&,int,int)> *)&local_48,&local_49);
  ForEachPixel(this,&this->allRgb_,&local_48);
  std::function<void_(QImage_&,_int,_int)>::~function(&local_48);
  QImage::QImage(local_78,(QImage *)&this->allRgb_);
  onAllRgbUpdated(this,local_78);
  QImage::~QImage(local_78);
  return;
}

Assistant:

void AllRgbWidget::onResetPixelsRequested()
{
    allRgb_ = QImage(4096, 4096, QImage::Format::Format_RGB32);

    ForEachPixel(allRgb_, [](QImage& target, int x, int y)
    {
        target.setPixel(x, y, x + (target.width() * y));
    });

    emit onAllRgbUpdated(allRgb_);
}